

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  size_t this_00;
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  uint local_bc;
  _Self local_b8 [3];
  _Self local_a0;
  int local_94;
  const_iterator cStack_90;
  value_type_conflict index;
  const_iterator __end2;
  const_iterator __begin2;
  MatIndexArray *__range2;
  undefined1 local_70 [8];
  set<int,_std::less<int>,_std::allocator<int>_> had;
  MatIndexArray *mindices;
  aiNode *nd_local;
  aiMatrix4x4 *node_global_transform_local;
  Model *model_local;
  MeshGeometry *mesh_local;
  FBXConverter *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  
  had._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)MeshGeometry::GetMaterialIndices(mesh);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     had._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar2 != 0) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
    this_00 = had._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)
                        had._M_t._M_impl.super__Rb_tree_header._M_node_count);
    cStack_90 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff70), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_94 = *piVar3;
      local_a0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,&local_94);
      local_b8[0]._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
      bVar1 = std::operator==(&local_a0,local_b8);
      if (bVar1) {
        local_bc = ConvertMeshMultiMaterial(this,mesh,model,local_94,node_global_transform,nd);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__return_storage_ptr__,&local_bc);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,&local_94);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
    return __return_storage_ptr__;
  }
  __assert_fail("mindices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                ,0x4c0,
                "std::vector<unsigned int> Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
               );
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            ai_assert(mindices.size());

            std::set<MatIndexArray::value_type> had;
            std::vector<unsigned int> indices;

            for (MatIndexArray::value_type index : mindices) {
                if (had.find(index) == had.end()) {

                    indices.push_back(ConvertMeshMultiMaterial(mesh, model, index, node_global_transform, nd));
                    had.insert(index);
                }
            }

            return indices;
        }